

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_b9a119::HandleRuntimeDependencySetMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer *ppbVar1;
  cmExecutionStatus *this;
  undefined8 this_00;
  bool bVar2;
  int iVar3;
  string *psVar4;
  cmArgumentParser<(anonymous_namespace)::HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
  *pcVar5;
  cmArgumentParser<ArgVectors> *pcVar6;
  reference str;
  ulong uVar7;
  cmGlobalGenerator *pcVar8;
  cmInstallRuntimeDependencySet *runtimeDependencySet_00;
  static_string_view sVar9;
  bool local_d55;
  bool local_d53;
  bool local_d51;
  RuntimeDependenciesArgs local_cb8;
  bool local_c0c;
  bool local_c0b;
  bool local_c0a;
  allocator<char> local_c09;
  undefined1 local_c08 [4];
  bool installsFramework;
  bool installsLibrary;
  bool installsRuntime;
  cmAlphaNum local_be8;
  cmAlphaNum local_bb8;
  string local_b88;
  ParseResult local_b68;
  ParseResult local_b38;
  ParseResult local_b08;
  undefined1 local_ad8 [8];
  RuntimeDependenciesArgs runtimeDependencyArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  undefined1 local_9f8 [8];
  cmInstallCommandArguments frameworkArgs;
  undefined1 local_820 [8];
  cmInstallCommandArguments runtimeArgs;
  undefined1 local_648 [8];
  cmInstallCommandArguments libraryArgs;
  undefined1 local_488 [7];
  bool success;
  string_view local_458;
  string local_448;
  undefined1 local_428 [8];
  cmInstallCommandArguments genericArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  runtimeDependencyArgVector;
  string runtimeDependencySetArg;
  ArgVectors argVectors;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  genericArgVector;
  cmArgumentParser<ArgVectors> local_1a8;
  cmInstallRuntimeDependencySet *local_138;
  cmInstallRuntimeDependencySet *runtimeDependencySet;
  cmAlphaNum local_128;
  cmAlphaNum local_f8;
  string local_c8;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  string system;
  Helper helper;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  helper.DefaultComponentName.field_2._8_8_ = status;
  Helper::Helper((Helper *)((long)&system.field_2 + 8),status);
  this = helper.Status;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"CMAKE_HOST_SYSTEM_NAME",&local_91);
  psVar4 = cmMakefile::GetSafeDefinition((cmMakefile *)this,&local_90);
  std::__cxx11::string::string((string *)local_70,(string *)psVar4);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  bVar2 = cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies((string *)local_70);
  this_00 = helper.DefaultComponentName.field_2._8_8_;
  if (bVar2) {
    if ((anonymous_namespace)::
        HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::argHelper == '\0') {
      iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::argHelper);
      if (iVar3 != 0) {
        local_1a8.super_Base.Bindings.Positions.
        super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
        .
        super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1a8.super_Base.Bindings.Positions.
        super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
        .
        super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1a8.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
        local_1a8.super_Base.Bindings.Positions.
        super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
        .
        super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1a8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
        local_1a8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager =
             (_Manager_type)0x0;
        local_1a8.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
        local_1a8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused.
        _M_object = (void *)0x0;
        local_1a8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
        local_1a8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
             (_Manager_type)0x0;
        local_1a8.super_Base.Bindings.Keywords.
        super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        .
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1a8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
        _M_object = (void *)0x0;
        local_1a8.super_Base.Bindings.Keywords.
        super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        .
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1a8.super_Base.Bindings.Keywords.
        super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        .
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        cmArgumentParser<ArgVectors>::cmArgumentParser(&local_1a8);
        sVar9 = ::cm::operator____s("LIBRARY",7);
        pcVar5 = (cmArgumentParser<(anonymous_namespace)::HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                  *)cmArgumentParser<(anonymous_namespace)::HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                    ::
                    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              ((cmArgumentParser<(anonymous_namespace)::HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                                *)&local_1a8,sVar9,0);
        sVar9 = ::cm::operator____s("RUNTIME",7);
        pcVar5 = (cmArgumentParser<(anonymous_namespace)::HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                  *)cmArgumentParser<(anonymous_namespace)::HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                    ::
                    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              (pcVar5,sVar9,0x18);
        sVar9 = ::cm::operator____s("FRAMEWORK",9);
        pcVar6 = cmArgumentParser<(anonymous_namespace)::HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                 ::
                 Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                           (pcVar5,sVar9,0x30);
        cmArgumentParser<ArgVectors>::cmArgumentParser
                  (&HandleRuntimeDependencySetMode::argHelper,pcVar6);
        cmArgumentParser<ArgVectors>::~cmArgumentParser(&local_1a8);
        __cxa_atexit(cmArgumentParser<ArgVectors>::~cmArgumentParser,
                     &HandleRuntimeDependencySetMode::argHelper,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::
                             HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                             ::argHelper);
      }
    }
    ppbVar1 = &argVectors.Framework.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ppbVar1);
    cmArgumentParser<(anonymous_namespace)::HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
    ::Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((ArgVectors *)((long)&runtimeDependencySetArg.field_2 + 8),
               (cmArgumentParser<(anonymous_namespace)::HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                *)&HandleRuntimeDependencySetMode::argHelper,args,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ppbVar1,0);
    std::__cxx11::string::string
              ((string *)
               &runtimeDependencyArgVector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&genericArgs.DefaultComponentName.field_2 + 8));
    std::__cxx11::string::string((string *)&local_448,(string *)&helper.Makefile);
    cmInstallCommandArguments::cmInstallCommandArguments
              ((cmInstallCommandArguments *)local_428,&local_448);
    std::__cxx11::string::~string((string *)&local_448);
    local_458 = (string_view)::cm::operator____s("RUNTIME_DEPENDENCY_SET",0x16);
    cmArgumentParser<void>::Bind<std::__cxx11::string>
              ((cmArgumentParser<void> *)local_428,(static_string_view)local_458,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &runtimeDependencyArgVector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmArgumentParser<void>::
    Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((ParseResult *)local_488,(cmArgumentParser<void> *)local_428,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&argVectors.Framework.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&genericArgs.DefaultComponentName.field_2 + 8),0);
    ArgumentParser::ParseResult::~ParseResult((ParseResult *)local_488);
    libraryArgs.DefaultComponentName.field_2._M_local_buf[0xf] =
         cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)local_428);
    std::__cxx11::string::string
              ((string *)(runtimeArgs.DefaultComponentName.field_2._M_local_buf + 8),
               (string *)&helper.Makefile);
    cmInstallCommandArguments::cmInstallCommandArguments
              ((cmInstallCommandArguments *)local_648,
               (string *)((long)&runtimeArgs.DefaultComponentName.field_2 + 8));
    std::__cxx11::string::~string
              ((string *)(runtimeArgs.DefaultComponentName.field_2._M_local_buf + 8));
    std::__cxx11::string::string
              ((string *)(frameworkArgs.DefaultComponentName.field_2._M_local_buf + 8),
               (string *)&helper.Makefile);
    cmInstallCommandArguments::cmInstallCommandArguments
              ((cmInstallCommandArguments *)local_820,
               (string *)((long)&frameworkArgs.DefaultComponentName.field_2 + 8));
    std::__cxx11::string::~string
              ((string *)(frameworkArgs.DefaultComponentName.field_2._M_local_buf + 8));
    std::__cxx11::string::string
              ((string *)
               &unknownArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&helper.Makefile);
    cmInstallCommandArguments::cmInstallCommandArguments
              ((cmInstallCommandArguments *)local_9f8,
               (string *)
               &unknownArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &unknownArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ppbVar1 = &runtimeDependencyArgs.PostExcludeFiles.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ppbVar1);
    cmArgumentParser<(anonymous_namespace)::RuntimeDependenciesArgs>::
    Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((RuntimeDependenciesArgs *)local_ad8,
               (cmArgumentParser<(anonymous_namespace)::RuntimeDependenciesArgs> *)
               (anonymous_namespace)::RuntimeDependenciesArgHelper,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&genericArgs.DefaultComponentName.field_2 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ppbVar1,0);
    cmArgumentParser<void>::
    Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (&local_b08,(cmArgumentParser<void> *)local_648,
               (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&runtimeDependencySetArg.field_2 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&runtimeDependencyArgs.PostExcludeFiles.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    ArgumentParser::ParseResult::~ParseResult(&local_b08);
    cmArgumentParser<void>::
    Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (&local_b38,(cmArgumentParser<void> *)local_820,
               (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&argVectors.Library.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&runtimeDependencyArgs.PostExcludeFiles.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    ArgumentParser::ParseResult::~ParseResult(&local_b38);
    cmArgumentParser<void>::
    Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (&local_b68,(cmArgumentParser<void> *)local_9f8,
               (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&argVectors.Runtime.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&runtimeDependencyArgs.PostExcludeFiles.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    ArgumentParser::ParseResult::~ParseResult(&local_b68);
    cmInstallCommandArguments::SetGenericArguments
              ((cmInstallCommandArguments *)local_648,(cmInstallCommandArguments *)local_428);
    cmInstallCommandArguments::SetGenericArguments
              ((cmInstallCommandArguments *)local_820,(cmInstallCommandArguments *)local_428);
    cmInstallCommandArguments::SetGenericArguments
              ((cmInstallCommandArguments *)local_9f8,(cmInstallCommandArguments *)local_428);
    local_d51 = false;
    if ((libraryArgs.DefaultComponentName.field_2._M_local_buf[0xf] & 1U) != 0) {
      local_d51 = cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)local_648);
    }
    libraryArgs.DefaultComponentName.field_2._M_local_buf[0xf] = local_d51;
    local_d53 = false;
    if (local_d51 != false) {
      local_d53 = cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)local_820);
    }
    libraryArgs.DefaultComponentName.field_2._M_local_buf[0xf] = local_d53;
    local_d55 = false;
    if (local_d53 != false) {
      local_d55 = cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)local_9f8);
    }
    libraryArgs.DefaultComponentName.field_2._M_local_buf[0xf] = local_d55;
    if (local_d55 == false) {
      args_local._7_1_ = false;
    }
    else {
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&runtimeDependencyArgs.PostExcludeFiles.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          pcVar8 = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
          runtimeDependencySet_00 =
               cmGlobalGenerator::GetNamedRuntimeDependencySet
                         (pcVar8,(string *)
                                 &runtimeDependencyArgVector.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_c0a = false;
          local_c0b = false;
          local_c0c = false;
          local_138 = runtimeDependencySet_00;
          RuntimeDependenciesArgs::RuntimeDependenciesArgs
                    (&local_cb8,(RuntimeDependenciesArgs *)local_ad8);
          AddInstallRuntimeDependenciesGenerator
                    ((Helper *)((long)&system.field_2 + 8),runtimeDependencySet_00,
                     (cmInstallCommandArguments *)local_820,(cmInstallCommandArguments *)local_648,
                     (cmInstallCommandArguments *)local_9f8,&local_cb8,&local_c0a,&local_c0b,
                     &local_c0c);
          RuntimeDependenciesArgs::~RuntimeDependenciesArgs(&local_cb8);
          if ((local_c0b & 1U) != 0) {
            pcVar8 = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
            psVar4 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                               ((cmInstallCommandArguments *)local_648);
            cmGlobalGenerator::AddInstallComponent(pcVar8,psVar4);
          }
          if ((local_c0a & 1U) != 0) {
            pcVar8 = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
            psVar4 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                               ((cmInstallCommandArguments *)local_820);
            cmGlobalGenerator::AddInstallComponent(pcVar8,psVar4);
          }
          if ((local_c0c & 1U) != 0) {
            pcVar8 = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
            psVar4 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                               ((cmInstallCommandArguments *)local_9f8);
            cmGlobalGenerator::AddInstallComponent(pcVar8,psVar4);
          }
          args_local._7_1_ = true;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_c08,
                     "RUNTIME_DEPENDENCY_SET not given a runtime dependency set.",&local_c09);
          Helper::SetError((Helper *)((long)&system.field_2 + 8),(string *)local_c08);
          std::__cxx11::string::~string((string *)local_c08);
          std::allocator<char>::~allocator(&local_c09);
          args_local._7_1_ = false;
        }
      }
      else {
        cmAlphaNum::cmAlphaNum(&local_bb8,"RUNTIME_DEPENDENCY_SET given unknown argument \"");
        str = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&runtimeDependencyArgs.PostExcludeFiles.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmAlphaNum::cmAlphaNum(&local_be8,str);
        cmStrCat<char[3]>(&local_b88,&local_bb8,&local_be8,(char (*) [3])0xd2b755);
        Helper::SetError((Helper *)((long)&system.field_2 + 8),&local_b88);
        std::__cxx11::string::~string((string *)&local_b88);
        args_local._7_1_ = false;
      }
    }
    runtimeDependencySet._0_4_ = 1;
    RuntimeDependenciesArgs::~RuntimeDependenciesArgs((RuntimeDependenciesArgs *)local_ad8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&runtimeDependencyArgs.PostExcludeFiles.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)local_9f8);
    cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)local_820);
    cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)local_648);
    cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)local_428);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&genericArgs.DefaultComponentName.field_2 + 8));
    std::__cxx11::string::~string
              ((string *)
               &runtimeDependencyArgVector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    HandleRuntimeDependencySetMode::ArgVectors::~ArgVectors
              ((ArgVectors *)((long)&runtimeDependencySetArg.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&argVectors.Framework.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_f8,"RUNTIME_DEPENDENCY_SET is not supported on system \"");
    cmAlphaNum::cmAlphaNum(&local_128,(string *)local_70);
    runtimeDependencySet._7_1_ = 0x22;
    cmStrCat<char>(&local_c8,&local_f8,&local_128,(char *)((long)&runtimeDependencySet + 7));
    cmExecutionStatus::SetError((cmExecutionStatus *)this_00,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    args_local._7_1_ = false;
    runtimeDependencySet._0_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_70);
  Helper::~Helper((Helper *)((long)&system.field_2 + 8));
  return args_local._7_1_;
}

Assistant:

bool HandleRuntimeDependencySetMode(std::vector<std::string> const& args,
                                    cmExecutionStatus& status)
{
  Helper helper(status);

  auto system = helper.Makefile->GetSafeDefinition("CMAKE_HOST_SYSTEM_NAME");
  if (!cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies(
        system)) {
    status.SetError(cmStrCat(
      "RUNTIME_DEPENDENCY_SET is not supported on system \"", system, '"'));
    return false;
  }

  // This is the RUNTIME_DEPENDENCY_SET mode.
  cmInstallRuntimeDependencySet* runtimeDependencySet;

  struct ArgVectors
  {
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Library;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Runtime;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Framework;
  };

  static auto const argHelper = cmArgumentParser<ArgVectors>{}
                                  .Bind("LIBRARY"_s, &ArgVectors::Library)
                                  .Bind("RUNTIME"_s, &ArgVectors::Runtime)
                                  .Bind("FRAMEWORK"_s, &ArgVectors::Framework);

  std::vector<std::string> genericArgVector;
  ArgVectors const argVectors = argHelper.Parse(args, &genericArgVector);

  // now parse the generic args (i.e. the ones not specialized on LIBRARY,
  // RUNTIME, FRAMEWORK etc. (see above)
  // These generic args also contain the runtime dependency set
  std::string runtimeDependencySetArg;
  std::vector<std::string> runtimeDependencyArgVector;
  cmInstallCommandArguments genericArgs(helper.DefaultComponentName);
  genericArgs.Bind("RUNTIME_DEPENDENCY_SET"_s, runtimeDependencySetArg);
  genericArgs.Parse(genericArgVector, &runtimeDependencyArgVector);
  bool success = genericArgs.Finalize();

  cmInstallCommandArguments libraryArgs(helper.DefaultComponentName);
  cmInstallCommandArguments runtimeArgs(helper.DefaultComponentName);
  cmInstallCommandArguments frameworkArgs(helper.DefaultComponentName);

  // Now also parse the file(GET_RUNTIME_DEPENDENCY) args
  std::vector<std::string> unknownArgs;
  auto runtimeDependencyArgs = RuntimeDependenciesArgHelper.Parse(
    runtimeDependencyArgVector, &unknownArgs);

  // now parse the args for specific parts of the target (e.g. LIBRARY,
  // RUNTIME, FRAMEWORK etc.
  libraryArgs.Parse(argVectors.Library, &unknownArgs);
  runtimeArgs.Parse(argVectors.Runtime, &unknownArgs);
  frameworkArgs.Parse(argVectors.Framework, &unknownArgs);

  libraryArgs.SetGenericArguments(&genericArgs);
  runtimeArgs.SetGenericArguments(&genericArgs);
  frameworkArgs.SetGenericArguments(&genericArgs);

  success = success && libraryArgs.Finalize();
  success = success && runtimeArgs.Finalize();
  success = success && frameworkArgs.Finalize();

  if (!success) {
    return false;
  }

  if (!unknownArgs.empty()) {
    helper.SetError(
      cmStrCat("RUNTIME_DEPENDENCY_SET given unknown argument \"",
               unknownArgs.front(), "\"."));
    return false;
  }

  if (runtimeDependencySetArg.empty()) {
    helper.SetError(
      "RUNTIME_DEPENDENCY_SET not given a runtime dependency set.");
    return false;
  }

  runtimeDependencySet =
    helper.Makefile->GetGlobalGenerator()->GetNamedRuntimeDependencySet(
      runtimeDependencySetArg);

  bool installsRuntime = false;
  bool installsLibrary = false;
  bool installsFramework = false;

  AddInstallRuntimeDependenciesGenerator(
    helper, runtimeDependencySet, runtimeArgs, libraryArgs, frameworkArgs,
    std::move(runtimeDependencyArgs), installsRuntime, installsLibrary,
    installsFramework);

  // Tell the global generator about any installation component names
  // specified
  if (installsLibrary) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      libraryArgs.GetComponent());
  }
  if (installsRuntime) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      runtimeArgs.GetComponent());
  }
  if (installsFramework) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      frameworkArgs.GetComponent());
  }

  return true;
}